

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JHandler.cpp
# Opt level: O2

void __thiscall JHandler::JHandler(JHandler *this,string *cfg)

{
  shared_ptr<JHandler::metadata> *psVar1;
  bool bVar2;
  value_variant *pvVar3;
  simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
  *psVar4;
  key_value_t *pkVar5;
  char *pcVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_c9;
  document doc;
  
  std::make_shared<JHandler::url>();
  psVar1 = &this->MD_ptr;
  std::make_shared<JHandler::metadata>();
  (this->error_msg)._M_dataplus._M_p = (pointer)&(this->error_msg).field_2;
  (this->error_msg)._M_string_length = 0;
  this_00 = &this->error_msg;
  (this->error_msg).field_2._M_local_buf[0] = '\0';
  this->status = false;
  pjson::document::document(&doc,0,0x1000,0);
  bVar2 = pjson::document::deserialize_start(&doc,(uint8 *)(cfg->_M_dataplus)._M_p);
  if (!bVar2) {
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (psVar7,"Error, bad data. [doc.deserialize_in_place()]",&local_c9);
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  bVar2 = pjson::value_variant::has_key(&doc.super_value_variant,"status");
  if (bVar2) {
    bVar2 = pjson::value_variant::has_key(&doc.super_value_variant,"data");
    if (bVar2) {
      pvVar3 = pjson::value_variant::operator[](&doc.super_value_variant,"status");
      bVar2 = pjson::value_variant::as_bool(pvVar3,false);
      this->status = bVar2;
      pvVar3 = pjson::value_variant::operator[](&doc.super_value_variant,"data");
      psVar4 = (simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
                *)pjson::value_variant::operator[](pvVar3,"file");
      pkVar5 = pjson::
               simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
               ::operator[](psVar4,0);
      pvVar3 = pjson::value_variant::operator[]((value_variant *)(pkVar5 + 0x10),0);
      pcVar6 = pjson::value_variant::as_string_ptr(pvVar3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&((this->url_ptr).super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->str_full,pcVar6);
      pvVar3 = pjson::value_variant::operator[](&doc.super_value_variant,"data");
      psVar4 = (simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
                *)pjson::value_variant::operator[](pvVar3,"file");
      pkVar5 = pjson::
               simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
               ::operator[](psVar4,0);
      pvVar3 = pjson::value_variant::operator[]((value_variant *)(pkVar5 + 0x10),1);
      pcVar6 = pjson::value_variant::as_string_ptr(pvVar3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&((this->url_ptr).super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->str_short,pcVar6);
      pvVar3 = pjson::value_variant::operator[](&doc.super_value_variant,"data");
      psVar4 = (simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
                *)pjson::value_variant::operator[](pvVar3,"file");
      pkVar5 = pjson::
               simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
               ::operator[](psVar4,1);
      pvVar3 = pjson::value_variant::operator[]((value_variant *)(pkVar5 + 0x10),0);
      pcVar6 = pjson::value_variant::as_string_ptr(pvVar3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&((psVar1->super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->id,pcVar6);
      pvVar3 = pjson::value_variant::operator[](&doc.super_value_variant,"data");
      psVar4 = (simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
                *)pjson::value_variant::operator[](pvVar3,"file");
      pkVar5 = pjson::
               simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
               ::operator[](psVar4,1);
      pvVar3 = pjson::value_variant::operator[]((value_variant *)(pkVar5 + 0x10),1);
      pcVar6 = pjson::value_variant::as_string_ptr(pvVar3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&((psVar1->super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->name,pcVar6);
      pvVar3 = pjson::value_variant::operator[](&doc.super_value_variant,"data");
      pvVar3 = pjson::value_variant::operator[](pvVar3,"file");
      pvVar3 = pjson::value_variant::operator[](pvVar3,"metadata");
      psVar4 = (simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
                *)pjson::value_variant::operator[](pvVar3,"size");
      pkVar5 = pjson::
               simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
               ::operator[](psVar4,1);
      pcVar6 = pjson::value_variant::as_string_ptr((value_variant *)(pkVar5 + 0x10));
      this_00 = &((psVar1->super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->size;
      goto LAB_00104376;
    }
  }
  bVar2 = pjson::value_variant::has_key(&doc.super_value_variant,"error");
  if (!bVar2) {
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (psVar7,"Error, bad JSON format, key [status] not found.",&local_c9);
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  psVar4 = (simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
            *)pjson::value_variant::operator[](&doc.super_value_variant,"error");
  pkVar5 = pjson::
           simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
           ::operator[](psVar4,0);
  pcVar6 = pjson::value_variant::as_string_ptr((value_variant *)(pkVar5 + 0x10));
LAB_00104376:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (this_00,pcVar6);
  pjson::document::~document(&doc);
  return;
}

Assistant:

JHandler::JHandler(const std::string &cfg) {
  status = false;
  pjson::document doc;
  try {
    if (doc.deserialize_in_place(const_cast<char*>(cfg.c_str()))) {
      if (doc.has_key("status") && doc.has_key("data")) {
        status = doc["status"].as_bool();
        url_ptr->str_full = doc["data"]["file"].get_object()[0].get_value()[0].as_string_ptr();
        url_ptr->str_short = doc["data"]["file"].get_object()[0].get_value()[1].as_string_ptr();
        MD_ptr->id = doc["data"]["file"].get_object()[1].get_value()[0].as_string_ptr();
        MD_ptr->name = doc["data"]["file"].get_object()[1].get_value()[1].as_string_ptr();
        MD_ptr->size = doc["data"]["file"]["metadata"]["size"].get_object()[1].get_value().as_string_ptr();

#ifdef DEBUG
        std::cout << "[DEBUG|CFG] : status is: " << status << std::endl;
        std::cout << "[DEBUG|CFG] : url full is: " << url_ptr->str_full << std::endl;
        std::cout << "[DEBUG|CFG] : url short is: " << url_ptr->str_short << std::endl;
        std::cout << "[DEBUG|CFG] MD id is: " << MD_ptr->id << std::endl;
        std::cout << "[DEBUG|CFG] MD name is: " << MD_ptr->name << std::endl;
        std::cout << "[DEBUG|CFG] MD size is: " << MD_ptr->size << std::endl;
#endif

      } else if(doc.has_key("error")) {
        error_msg = doc["error"].get_object()[0].get_value().as_string_ptr();
#ifdef DEBUG
        std::cout << "[DEBUG|CFG] error_msg : " << error_msg << std::endl;
#endif
      }
      else
        throw std::string("Error, bad JSON format, key [status] not found.");
    } else
      throw std::string("Error, bad data. [doc.deserialize_in_place()]");
  }
  catch(const std::string& e) {
    std::cerr << e << std::endl;
  }
}